

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O3

enable_if_t<_std::is_copy_constructible<unique_ptr<int>_>::value>
burst::management::copy<std::unique_ptr<int,std::default_delete<int>>>(void *param_1,void *param_2)

{
  char *pcVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  runtime_error *this;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong *puVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  size_type __dnew;
  size_type __dnew_1;
  string type_name;
  ulong *local_d8;
  ulong local_d0;
  ulong local_c8 [2];
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  ulong local_78;
  ulong **local_70;
  ulong *local_68;
  ulong *local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar7 = 0x36;
  pcVar9 = "std::unique_ptr<int>>::n() [T = std::unique_ptr<int>]";
  lVar3 = 0;
  do {
    lVar11 = 0;
    while (pcVar9[lVar11] == (&boost::typeindex::detail::ctti_skip_until_runtime)[lVar11]) {
      if (lVar11 == 3) {
        if (lVar3 == 0x36) goto LAB_001a79f1;
        pcVar9 = "static const char *boost::detail::ctti<std::unique_ptr<int>>::n() [T = std::unique_ptr<int>]"
                 + lVar3 + 0x2b;
        goto LAB_001a7a09;
      }
      lVar11 = lVar11 + 1;
      if (lVar7 == lVar11) goto LAB_001a79f1;
    }
    lVar3 = lVar3 + 1;
    lVar7 = lVar7 + -1;
    pcVar9 = pcVar9 + 1;
  } while (lVar3 != 0x36);
LAB_001a79f1:
  pcVar9 = "std::unique_ptr<int>>::n() [T = std::unique_ptr<int>]";
LAB_001a7a09:
  sVar4 = strlen(pcVar9 + 1);
  pcVar10 = pcVar9 + sVar4 + 1;
  do {
    pcVar1 = pcVar10 + -2;
    pcVar10 = pcVar10 + -1;
  } while (*pcVar1 == ' ');
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar9);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_70 = local_60;
  local_d8 = (ulong *)0x16;
  local_70 = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_d8);
  local_60[0] = local_d8;
  *local_70 = (ulong *)0xb5d08ad1b1d09ed0;
  local_70[1] = (ulong *)0xd082d12082d1bad0;
  pcVar9 = (char *)((long)local_70 + 0xe);
  pcVar9[0] = -0x7e;
  pcVar9[1] = -0x30;
  pcVar9[2] = -0x48;
  pcVar9[3] = -0x30;
  pcVar9[4] = -0x41;
  pcVar9[5] = -0x30;
  pcVar9[6] = -0x50;
  pcVar9[7] = ' ';
  local_68 = local_d8;
  *(char *)((long)local_70 + (long)local_d8) = '\0';
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
  local_98 = (ulong *)*plVar5;
  puVar8 = (ulong *)(plVar5 + 2);
  if (local_98 == puVar8) {
    local_88 = *puVar8;
    lStack_80 = plVar5[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar8;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_d8 = local_c8;
  local_78 = 0x15;
  local_d8 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_78);
  local_c8[0] = local_78;
  *local_d8 = 0xd0bad0b5d0bdd020;
  local_d8[1] = 0xd180d1b8d0bfd0be;
  builtin_strncpy((char *)((long)local_d8 + 0xd),"руем",8);
  local_d0 = local_78;
  *(char *)((long)local_d8 + local_78) = '\0';
  uVar12 = 0xf;
  if (local_98 != &local_88) {
    uVar12 = local_88;
  }
  if (uVar12 < local_78 + local_90) {
    uVar12 = 0xf;
    if (local_d8 != local_c8) {
      uVar12 = local_78;
    }
    if (local_78 + local_90 <= uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_98);
      goto LAB_001a7ba9;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8);
LAB_001a7ba9:
  local_b8 = (undefined8 *)*puVar6;
  puVar2 = puVar6 + 2;
  if (local_b8 == puVar2) {
    local_a8 = *puVar2;
    uStack_a0 = puVar6[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar2;
  }
  local_b0 = puVar6[1];
  *puVar6 = puVar2;
  puVar6[1] = 0;
  *(undefined1 *)puVar2 = 0;
  std::runtime_error::runtime_error(this,(string *)&local_b8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto copy (const void *, void *)
            ->
                std::enable_if_t
                <
                    not std::is_copy_constructible<T>::value
                >
        {
            auto type_name = boost::typeindex::ctti_type_index::type_id<T>().pretty_name();
            using literals::operator ""_u8s;
            throw std::runtime_error(u8"Объект типа "_u8s + type_name + u8" некопируем"_u8s);
        }